

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTPNDstrBase::adjust_for_dyn(CTPNDstrBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  _func_int **len;
  CTcPrsNode *pCVar2;
  
  if (info->speculative == 0) {
    pCVar2 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var1 = (_func_int **)this->str_;
    len = (_func_int **)this->len_;
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR___cxa_pure_virtual_003160f0;
    pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    pCVar2[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = len;
    CTcGenTarg::note_str(G_cg,(size_t)len);
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031fec8;
    return pCVar2;
  }
  err_throw(0x9c5);
}

Assistant:

CTcPrsNode *CTPNDstrBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* 
     *   don't allow dstring evaluation in speculative mode, since we
     *   can't execute anything with side effects in this mode 
     */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* return a debugger dstring node */
    return new CTPNDebugDstr(str_, len_);
}